

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Own<kj::Directory::Replacer<kj::Directory>_> __thiscall
kj::anon_unknown_8::DiskDirectory::replaceSubdir(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  undefined8 uVar1;
  size_t sVar2;
  Iface *pIVar3;
  int iVar4;
  uint uVar5;
  Clock *clock;
  undefined8 *puVar6;
  AutoCloseFd AVar7;
  undefined4 in_register_0000000c;
  Replacer<kj::Directory> *extraout_RDX;
  Replacer<kj::Directory> *extraout_RDX_00;
  Replacer<kj::Directory> *pRVar8;
  Replacer<kj::Directory> *extraout_RDX_01;
  char *pcVar9;
  WriteMode in_R8D;
  size_t *this_00;
  int iVar10;
  Directory *ptrCopy;
  Own<kj::Directory::Replacer<kj::Directory>_> OVar11;
  PathPtr finalName;
  AutoCloseFd subdirFd;
  NullableValue<kj::String> temp;
  mode_t acl;
  AutoCloseFd local_a8;
  AutoCloseFd local_a0;
  NullableValue<kj::String> local_98;
  char local_78;
  char *local_70;
  size_t sStack_68;
  ArrayDisposer *pAStack_60;
  Function<int_(kj::StringPtr)> local_58;
  undefined4 local_44;
  PathPtr local_40;
  
  finalName.parts.size_ = CONCAT44(in_register_0000000c,mode);
  finalName.parts.ptr = (String *)path.parts.size_;
  this_00 = &((path.parts.ptr)->content).size_;
  local_44 = 0x1c0;
  if ((in_R8D & PRIVATE) == 0) {
    local_44 = 0x1ff;
  }
  local_40.parts.ptr = finalName.parts.ptr;
  local_40.parts.size_ = finalName.parts.size_;
  local_58.impl.ptr = (Iface *)operator_new(0x18);
  (local_58.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002d1998;
  local_58.impl.ptr[1]._vptr_Iface = (_func_int **)this_00;
  local_58.impl.ptr[2]._vptr_Iface = (_func_int **)&local_44;
  local_58.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::replaceSubdir(kj::PathPtr,kj::WriteMode)const::{lambda(kj::StringPtr)#1}>>
        ::instance;
  DiskHandle::createNamedTemporary
            ((Maybe<kj::String> *)&local_98,(DiskHandle *)this_00,finalName,in_R8D,&local_58);
  pIVar3 = local_58.impl.ptr;
  local_78 = local_98.isSet;
  if (local_98.isSet == true) {
    local_70 = local_98.field_1.value.content.ptr;
    sStack_68 = local_98.field_1.value.content.size_;
    pAStack_60 = local_98.field_1.value.content.disposer;
    local_98.field_1.value.content.ptr = (char *)0x0;
    local_98.field_1.value.content.size_ = 0;
  }
  if (local_58.impl.ptr != (Iface *)0x0) {
    local_58.impl.ptr = (Iface *)0x0;
    (**(local_58.impl.disposer)->_vptr_Disposer)
              (local_58.impl.disposer,pIVar3->_vptr_Iface[-2] + (long)&pIVar3->_vptr_Iface);
  }
  if (local_78 == '\x01') {
    do {
      pcVar9 = "";
      if (sStack_68 != 0) {
        pcVar9 = local_70;
      }
      iVar4 = openat((int)*this_00,pcVar9,0x90000);
      if (-1 < iVar4) {
        iVar10 = 0;
        break;
      }
      uVar5 = kj::_::Debug::getOsErrorNumber(false);
      finalName.parts.size_ = finalName.parts.size_ & 0xffffffff;
      if (uVar5 != 0xffffffff) {
        finalName.parts.size_ = (ulong)uVar5;
      }
      iVar10 = (int)finalName.parts.size_;
    } while (uVar5 == 0xffffffff);
    if (iVar10 != 0) {
      local_a8.fd = 0;
      local_a8.unwindDetector.uncaughtCount = 0;
      local_98.isSet = false;
      local_98._1_7_ = 0;
      local_98.field_1.value.content.ptr = (char *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_a8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_a8);
    }
    local_a8.fd = iVar4;
    UnwindDetector::UnwindDetector(&local_a8.unwindDetector);
    local_a0.fd = local_a8.fd;
    UnwindDetector::UnwindDetector(&local_a0.unwindDetector);
    local_a8.fd = -1;
    puVar6 = (undefined8 *)operator_new(0x10);
    *puVar6 = &PTR_getFd_002d0988;
    *(int *)(puVar6 + 1) = local_a0.fd;
    UnwindDetector::UnwindDetector((UnwindDetector *)((long)puVar6 + 0xc));
    local_a0.fd = -1;
    *puVar6 = &PTR_getFd_002d1680;
    PathPtr::toString((String *)&local_98,&local_40,false);
    AVar7 = (AutoCloseFd)operator_new(0x60);
    *(WriteMode *)((long)AVar7 + 8) = in_R8D;
    *(undefined ***)AVar7 = &PTR_get_002d1a00;
    *(undefined8 **)((long)AVar7 + 0x10) =
         &kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskDirectory>::instance;
    *(undefined8 **)((long)AVar7 + 0x18) = puVar6;
    *(size_t **)((long)AVar7 + 0x20) = this_00;
    *(char **)((long)AVar7 + 0x28) = local_70;
    *(size_t *)((long)AVar7 + 0x30) = sStack_68;
    *(ArrayDisposer **)((long)AVar7 + 0x38) = pAStack_60;
    local_70 = (char *)0x0;
    sStack_68 = 0;
    *(undefined8 *)((long)AVar7 + 0x40) = local_98._0_8_;
    *(char **)((long)AVar7 + 0x48) = local_98.field_1.value.content.ptr;
    *(size_t *)((long)AVar7 + 0x50) = local_98.field_1.value.content.size_;
    local_98.isSet = false;
    local_98._1_7_ = 0;
    local_98.field_1.value.content.ptr = (char *)0x0;
    *(undefined1 *)((long)AVar7 + 0x58) = 0;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::Directory>>::
          instance;
    (this->super_DiskHandle).fd = AVar7;
    AutoCloseFd::~AutoCloseFd(&local_a0);
    AutoCloseFd::~AutoCloseFd(&local_a8);
    pRVar8 = extraout_RDX_00;
  }
  else {
    clock = nullClock();
    newInMemoryDirectory((kj *)&local_98,clock);
    AVar7 = (AutoCloseFd)operator_new(0x20);
    uVar1 = local_98.field_1.value.content.ptr;
    local_98.field_1.value.content.ptr = (char *)0x0;
    *(undefined4 *)((long)AVar7 + 8) = 3;
    *(undefined ***)AVar7 = &PTR_get_002d1a70;
    *(undefined8 *)((long)AVar7 + 0x10) = local_98._0_8_;
    *(undefined8 *)((long)AVar7 + 0x18) = uVar1;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::BrokenReplacer<kj::Directory>>
          ::instance;
    (this->super_DiskHandle).fd = AVar7;
    pRVar8 = extraout_RDX;
  }
  sVar2 = sStack_68;
  pcVar9 = local_70;
  if ((local_78 == '\x01') && (local_70 != (char *)0x0)) {
    local_70 = (char *)0x0;
    sStack_68 = 0;
    (**pAStack_60->_vptr_ArrayDisposer)(pAStack_60,pcVar9,1,sVar2,sVar2,0);
    pRVar8 = extraout_RDX_01;
  }
  OVar11.ptr = pRVar8;
  OVar11.disposer = (Disposer *)this;
  return OVar11;
}

Assistant:

Own<Replacer<Directory>> replaceSubdir(PathPtr path, WriteMode mode) const override {
    return DiskHandle::replaceSubdir(path, mode);
  }